

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8skin.cpp
# Opt level: O1

ObjPipeline * rw::d3d8::makeSkinPipeline(void)

{
  ObjPipeline *pOVar1;
  
  pOVar1 = ObjPipeline::create();
  pOVar1->instanceCB = defaultInstanceCB;
  pOVar1->uninstanceCB = defaultUninstanceCB;
  pOVar1->renderCB = defaultRenderCB;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 1;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeSkinPipeline(void)
{
	ObjPipeline *pipe = ObjPipeline::create();
	pipe->instanceCB = defaultInstanceCB;
	pipe->uninstanceCB = defaultUninstanceCB;
	pipe->renderCB = defaultRenderCB;
	pipe->pluginID = ID_SKIN;
	pipe->pluginData = 1;
	return pipe;
}